

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<Js::NumberTrio,Js::NumberTrio,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::NumberTrio,Js::NumberTrio,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)2>
          (BaseDictionary<Js::NumberTrio,Js::NumberTrio,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
           *this,NumberTrio *key,NumberTrio *value)

{
  BaseDictionary<Js::NumberTrio,Js::NumberTrio,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
  *pBVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined4 *puVar4;
  long lVar5;
  code *pcVar6;
  bool bVar7;
  hash_t hVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  uint key_00;
  undefined8 *in_FS_OFFSET;
  
  lVar14 = *(long *)this;
  if (lVar14 == 0) {
    BaseDictionary<Js::NumberTrio,_Js::NumberTrio,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::NumberTrio,_Js::NumberTrio,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar14 = *(long *)this;
  }
  key_00 = key->y * 0x400 + key->x * 0x100000 + key->z & 0x7fffffff;
  hVar8 = PrimePolicy::ModPrime(key_00,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar12 = *(uint *)(lVar14 + (ulong)hVar8 * 4);
  if ((int)uVar12 < 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    do {
      puVar2 = (undefined8 *)(*(long *)(this + 8) + (ulong)uVar12 * 0x10);
      uVar3 = *(undefined8 *)(*(long *)(this + 8) + (ulong)uVar12 * 0x10);
      if (((key->x == (uint32)uVar3) && (key->y == (uint32)((ulong)uVar3 >> 0x20))) &&
         (key->z == *(uint32 *)(puVar2 + 1))) {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar11);
        }
        *(uint32 *)(puVar2 + 1) = value->z;
        *puVar2 = *(undefined8 *)value;
        return uVar12;
      }
      uVar11 = uVar11 + 1;
      uVar12 = *(uint *)((long)puVar2 + 0xc);
    } while (-1 < (int)uVar12);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar11);
  }
  if (*(int *)(this + 0x28) == 0) {
    iVar9 = *(int *)(this + 0x18);
    iVar13 = *(int *)(this + 0x20);
    if (iVar13 == iVar9) {
      BaseDictionary<Js::NumberTrio,_Js::NumberTrio,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Resize((BaseDictionary<Js::NumberTrio,_Js::NumberTrio,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                *)this);
      hVar8 = PrimePolicy::ModPrime(key_00,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
      iVar9 = *(int *)(this + 0x18);
      iVar13 = *(int *)(this + 0x20);
    }
    *(int *)(this + 0x20) = iVar13 + 1;
    if (iVar9 < iVar13 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)*in_FS_OFFSET;
      *puVar4 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar7) goto LAB_001f3e85;
      *puVar4 = 0;
      iVar9 = *(int *)(this + 0x18);
    }
    if (iVar9 <= iVar13) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)*in_FS_OFFSET;
      *puVar4 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar7) goto LAB_001f3e85;
      *puVar4 = 0;
    }
  }
  else {
    if (*(int *)(this + 0x28) < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)*in_FS_OFFSET;
      *puVar4 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar7) goto LAB_001f3e85;
      *puVar4 = 0;
    }
    iVar13 = *(int *)(this + 0x24);
    if (iVar13 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)*in_FS_OFFSET;
      *puVar4 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar7) goto LAB_001f3e85;
      *puVar4 = 0;
      iVar13 = *(int *)(this + 0x24);
    }
    if (*(int *)(this + 0x20) <= iVar13) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)*in_FS_OFFSET;
      *puVar4 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar7) {
LAB_001f3e85:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar4 = 0;
      iVar13 = *(int *)(this + 0x24);
    }
    pBVar1 = this + 0x28;
    *(int *)pBVar1 = *(int *)pBVar1 + -1;
    if (*(int *)pBVar1 != 0) {
      iVar9 = BaseDictionary<Js::NumberTrio,_Js::NumberTrio,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::GetNextFreeEntryIndex((EntryType *)((long)iVar13 * 0x10 + *(long *)(this + 8)));
      *(int *)(this + 0x24) = iVar9;
    }
  }
  lVar14 = *(long *)(this + 8);
  lVar10 = (long)iVar13 * 0x10;
  *(uint32 *)(lVar14 + 8 + lVar10) = value->z;
  *(undefined8 *)(lVar14 + lVar10) = *(undefined8 *)value;
  lVar14 = *(long *)this;
  lVar5 = *(long *)(this + 8);
  *(undefined4 *)(lVar5 + 0xc + lVar10) = *(undefined4 *)(lVar14 + (ulong)hVar8 * 4);
  *(int *)(lVar14 + (ulong)hVar8 * 4) = iVar13;
  uVar11 = 0;
  iVar9 = iVar13;
  do {
    iVar9 = *(int *)(lVar5 + 0xc + (long)iVar9 * 0x10);
    uVar11 = uVar11 + 1;
  } while (iVar9 != -1);
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar11);
  }
  return iVar13;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }